

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O0

fdb_status fdb_kvs_close(fdb_kvs_handle *handle)

{
  fdb_kvs_handle *in_RDI;
  fdb_status fs;
  char *in_stack_00000010;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  fdb_status fVar1;
  
  if (in_RDI == (fdb_kvs_handle *)0x0) {
    fVar1 = FDB_RESULT_INVALID_HANDLE;
  }
  else if (in_RDI->num_iterators == 0) {
    if ((in_RDI->shandle == (snap_handle *)0x0) || (in_RDI->kvs != (kvs_info *)0x0)) {
      if ((in_RDI->kvs == (kvs_info *)0x0) || (in_RDI->kvs->type == '\0')) {
        if (in_RDI->fhandle->root == in_RDI) {
          fdb_assert_die(in_stack_00000010,(char *)handle,fs,
                         CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                         (uint64_t)in_RDI);
        }
        pthread_spin_lock(&in_RDI->fhandle->lock);
        fVar1 = _fdb_close((fdb_kvs_handle *)
                           CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
        if (fVar1 == FDB_RESULT_SUCCESS) {
          if (in_RDI->kvs != (kvs_info *)0x0) {
            fdb_kvs_info_free((fdb_kvs_handle *)0x163de5);
          }
          list_remove(in_RDI->fhandle->handles,&in_RDI->node->le);
          pthread_spin_unlock(&in_RDI->fhandle->lock);
          free(in_RDI->node);
          free(in_RDI);
        }
        else {
          pthread_spin_unlock(&in_RDI->fhandle->lock);
        }
      }
      else if ((in_RDI->kvs == (kvs_info *)0x0) || (in_RDI->kvs->root != (fdb_kvs_handle *)0x0)) {
        fVar1 = _fdb_kvs_close(in_RDI);
        if (fVar1 == FDB_RESULT_SUCCESS) {
          fdb_kvs_info_free((fdb_kvs_handle *)0x163e97);
          free(in_RDI);
        }
      }
      else {
        fVar1 = FDB_RESULT_INVALID_ARGS;
      }
    }
    else {
      fVar1 = _fdb_close((fdb_kvs_handle *)
                         CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      if (fVar1 == FDB_RESULT_SUCCESS) {
        free(in_RDI);
      }
    }
  }
  else {
    fVar1 = FDB_RESULT_KV_STORE_BUSY;
  }
  return fVar1;
}

Assistant:

fdb_status _fdb_kvs_close(fdb_kvs_handle *handle)
{
    fdb_kvs_handle *root_handle = handle->fhandle->root;
    fdb_status fs;

    if (handle->node) {
        spin_lock(&root_handle->fhandle->lock);
        list_remove(root_handle->fhandle->handles, &handle->node->le);
        spin_unlock(&root_handle->fhandle->lock);
        free(handle->node);
    } // 'handle->node == NULL' happens only during rollback

    fs = _fdb_close(handle);
    return fs;
}